

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O2

uint vkt::pipeline::anon_unknown_0::getSwizzledComp<unsigned_int>
               (Vector<unsigned_int,_4> *vec,VkComponentSwizzle comp,int identityNdx)

{
  long lVar1;
  
  if (comp == VK_COMPONENT_SWIZZLE_ONE) {
    return 1;
  }
  if (comp != VK_COMPONENT_SWIZZLE_ZERO) {
    if (comp == VK_COMPONENT_SWIZZLE_IDENTITY) {
      lVar1 = (long)identityNdx;
    }
    else {
      lVar1 = (long)(int)(comp - VK_COMPONENT_SWIZZLE_R);
    }
    return vec->m_data[lVar1];
  }
  return 0;
}

Assistant:

ScalarType getSwizzledComp (const tcu::Vector<ScalarType, 4>& vec, vk::VkComponentSwizzle comp, int identityNdx)
{
	if (comp == vk::VK_COMPONENT_SWIZZLE_IDENTITY)
		return vec[identityNdx];
	else if (comp == vk::VK_COMPONENT_SWIZZLE_ZERO)
		return ScalarType(0);
	else if (comp == vk::VK_COMPONENT_SWIZZLE_ONE)
		return ScalarType(1);
	else
		return vec[comp - vk::VK_COMPONENT_SWIZZLE_R];
}